

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O3

int dosearch0(int aflag)

{
  char cVar1;
  short sVar2;
  level *plVar3;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  obj *poVar12;
  trap *trap;
  monst *pmVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  uint uVar17;
  char *pcVar18;
  int iVar19;
  monst *worm;
  bool bVar20;
  int local_74;
  int local_70;
  ulong local_68;
  
  if ((u._1052_1_ & 1) == 0) {
    local_70 = 0;
    if (((uwep != (obj *)0x0) && (uwep->oartifact != '\0')) &&
       (bVar4 = spec_ability(uwep,0x200), bVar4 != '\0')) {
      local_70 = (int)uwep->spe;
    }
    if (((ublindf != (obj *)0x0) && (ublindf->otyp == 0xed)) &&
       (((u.uprops[0x1e].intrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        (ublindf->oartifact == '\x1d')))) {
      local_70 = local_70 + 2;
    }
    uVar5 = (uint)u.ux;
    local_68 = (ulong)(uVar5 - 1);
    local_74 = (int)(char)(uVar5 - 1);
    if (local_74 < (int)(uVar5 + 2)) {
      iVar9 = 5;
      if (local_70 < 5) {
        iVar9 = local_70;
      }
      uVar17 = 7 - iVar9;
      uVar14 = (uint)(byte)u.uy;
      do {
        iVar19 = (int)(char)((char)uVar14 + -1);
        if (iVar19 < (char)uVar14 + 2) {
          uVar10 = local_68 & 0xff;
          uVar5 = uVar14;
          do {
            if ((byte)((char)local_68 - 1U) < 0x4f) {
              bVar16 = (byte)(uVar5 - 1);
              if ((bVar16 < 0x15) && ((bVar16 != (byte)uVar14 || ((char)local_68 != u.ux)))) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00162836;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00162831;
                }
                else {
LAB_00162831:
                  if (ublindf == (obj *)0x0) {
                    if (aflag != 0) goto LAB_0016287d;
                  }
                  else {
LAB_00162836:
                    if ((aflag != 0) || (ublindf->oartifact == '\x1d')) goto LAB_0016287d;
                  }
                  feel_location((char)local_68,bVar16);
                }
LAB_0016287d:
                uVar14 = uVar5 - 1 & 0xff;
                cVar1 = level->locations[uVar10][uVar14].typ;
                if (cVar1 == '\x10') {
                  uVar6 = mt_random();
                  uVar6 = uVar6 % uVar17;
                  lVar15 = (long)u.uluck;
                  lVar11 = (long)u.moreluck;
                  if (((int)(lVar11 + lVar15) == 0) ||
                     (uVar7 = mt_random(),
                     SUB168(ZEXT416(uVar7) % SEXT816(0x32 - (lVar11 + lVar15)),0) == 0)) {
LAB_00162aa8:
                    if (uVar6 != 0) goto LAB_001627fd;
                  }
                  else {
                    iVar8 = (int)u.moreluck + (int)u.uluck;
                    if (-6 < iVar8 && -9 < local_70) {
                      iVar8 = (int)(short)((short)iVar8 / 3);
                    }
                    uVar6 = uVar6 - iVar8;
                    if (-1 < (int)uVar6) {
                      if ((int)uVar17 <= (int)uVar6) {
                        uVar6 = 6U - iVar9;
                      }
                      goto LAB_00162aa8;
                    }
                  }
                  level->locations[uVar10][uVar14].typ = '\x18';
                  unblock_point(local_74,iVar19);
                  exercise(2,'\x01');
                  nomul(0,(char *)0x0);
                  newsym(local_74,iVar19);
                  if (flags.verbose == '\0') goto LAB_001627fd;
                  pcVar18 = "You find a secret passage.";
                }
                else {
                  if (cVar1 != '\x0f') {
                    pmVar13 = level->monsters[uVar10][uVar14];
                    if (pmVar13 == (monst *)0x0) {
                      bVar20 = false;
LAB_00162bad:
                      if ((aflag == 0) && (!bVar20)) {
                        if (u.uprops[0x1e].intrinsic == 0) {
                          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00162bdf;
                          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00162bd6;
LAB_00162c92:
                          if ((level->locations[uVar10][uVar14].field_0x6 & 8) != 0) {
                            unmap_object(local_74,iVar19);
                            newsym(local_74,iVar19);
                          }
                        }
                        else {
LAB_00162bd6:
                          if (ublindf != (obj *)0x0) {
LAB_00162bdf:
                            if (ublindf->oartifact == '\x1d') goto LAB_00162c92;
                          }
                        }
                      }
                    }
                    else {
                      bVar20 = (pmVar13->field_0x61 & 2) == 0;
                      worm = (monst *)0x0;
                      if (bVar20) {
                        worm = pmVar13;
                      }
                      if ((aflag != 0) || (worm == (monst *)0x0)) goto LAB_00162bad;
                      if (worm->m_ap_type != '\0') {
                        seemimic(worm);
LAB_00162b6b:
                        exercise(2,'\x01');
                        if (worm->wormno == '\0') {
                          if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_00162dec;
                          if (u.uprops[0x1e].intrinsic == 0) {
                            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed))
                            goto LAB_00162d38;
                            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00162d2f;
                          }
                          else {
LAB_00162d2f:
                            if (ublindf == (obj *)0x0) goto LAB_00162e3d;
LAB_00162d38:
                            if (ublindf->oartifact != '\x1d') goto LAB_00162e3d;
                          }
                          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                              ((viz_array[worm->my][worm->mx] & 1U) != 0)) &&
                             ((worm->data->mflags3 & 0x200) != 0)) goto LAB_00162dec;
LAB_00162e3d:
                          if (((worm->data->mflags1 & 0x10000) == 0) &&
                             ((poVar12 = which_armor(worm,4), poVar12 == (obj *)0x0 ||
                              (poVar12 = which_armor(worm,4), poVar12->otyp != 0x4f)))) {
                            if (u.uprops[0x1e].intrinsic == 0) {
                              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed))
                              goto LAB_00162e9c;
                              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00162e97;
                            }
                            else {
LAB_00162e97:
                              if (ublindf != (obj *)0x0) {
LAB_00162e9c:
                                if (ublindf->oartifact == '\x1d') goto LAB_00162f2d;
                              }
                              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e)
                                   || (u.uprops[0x19].extrinsic != 0 ||
                                      u.uprops[0x19].intrinsic != 0)) ||
                                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                              goto LAB_00163317;
                            }
LAB_00162f2d:
                            if ((u.uprops[0x19].extrinsic != 0) &&
                               ((u.uprops[0x19].blocked == 0 &&
                                (iVar19 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy),
                                iVar19 < 0x41)))) goto LAB_00163317;
                          }
                          if ((u.uprops[0x42].intrinsic == 0) &&
                             ((u.uprops[0x42].extrinsic == 0 &&
                              (bVar4 = match_warn_of_mon(worm), bVar4 == '\0')))) {
                            if ((level->locations[uVar10][uVar14].field_0x6 & 8) == 0) {
                              pline("You feel an unseen monster!");
                              map_invisible((char)local_68,bVar16);
                              return 1;
                            }
                            goto LAB_001627fd;
                          }
                        }
                        else {
                          bVar4 = worm_known(level,worm);
                          if (bVar4 == '\0') goto LAB_00162e3d;
LAB_00162dec:
                          uVar6 = *(uint *)&worm->field_0x60;
                          if ((((uVar6 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                             (u.uprops[0xc].extrinsic == 0)) {
                            if (((uVar6 & 0x280) == 0) &&
                               (((youmonst.data)->mflags1 & 0x1000000) != 0)) goto LAB_00162e2f;
                            goto LAB_00162e3d;
                          }
                          if ((uVar6 & 0x280) != 0) goto LAB_00162e3d;
LAB_00162e2f:
                          if ((u._1052_1_ & 0x20) != 0) goto LAB_00162e3d;
                        }
LAB_00163317:
                        if (((worm->data->mflags1 & 0x10000) != 0) ||
                           ((poVar12 = which_armor(worm,4), poVar12 != (obj *)0x0 &&
                            (poVar12 = which_armor(worm,4), poVar12->otyp == 0x4f))))
                        goto LAB_0016349e;
                        if (u.uprops[0x1e].intrinsic == 0) {
                          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016337a;
                          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00163375;
                        }
                        else {
LAB_00163375:
                          if (ublindf != (obj *)0x0) {
LAB_0016337a:
                            if (ublindf->oartifact == '\x1d') goto LAB_00163466;
                          }
                          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
                            return 1;
                          }
                        }
LAB_00163466:
                        if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
                           (iVar9 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy),
                           iVar9 < 0x41)) {
                          return 1;
                        }
LAB_0016349e:
                        if (u.uprops[0x42].intrinsic != 0) {
                          return 1;
                        }
                        if (u.uprops[0x42].extrinsic != 0) {
                          return 1;
                        }
                        bVar4 = match_warn_of_mon(pmVar13);
                        if (bVar4 != '\0') {
                          return 1;
                        }
                        pcVar18 = a_monnam(pmVar13);
                        pline("You find %s.",pcVar18);
                        return 1;
                      }
                      if (worm->wormno == '\0') {
                        if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0016301a;
                        if (u.uprops[0x1e].intrinsic == 0) {
                          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00162d87;
                          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00162d7e;
                        }
                        else {
LAB_00162d7e:
                          if (ublindf == (obj *)0x0) goto LAB_0016306b;
LAB_00162d87:
                          if (ublindf->oartifact != '\x1d') goto LAB_0016306b;
                        }
                        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                            ((viz_array[worm->my][worm->mx] & 1U) != 0)) &&
                           ((worm->data->mflags3 & 0x200) != 0)) goto LAB_0016301a;
LAB_0016306b:
                        if (((worm->data->mflags1 & 0x10000) == 0) &&
                           ((poVar12 = which_armor(worm,4), poVar12 == (obj *)0x0 ||
                            (poVar12 = which_armor(worm,4), poVar12->otyp != 0x4f)))) {
                          if (u.uprops[0x1e].intrinsic == 0) {
                            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed))
                            goto LAB_001630ca;
                            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001630c5;
                          }
                          else {
LAB_001630c5:
                            if (ublindf != (obj *)0x0) {
LAB_001630ca:
                              if (ublindf->oartifact == '\x1d') goto LAB_0016315c;
                            }
                            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0))
                                 || youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                            goto LAB_001631b8;
                          }
LAB_0016315c:
                          if ((u.uprops[0x19].extrinsic != 0) &&
                             ((u.uprops[0x19].blocked == 0 &&
                              (iVar8 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy),
                              iVar8 < 0x41)))) goto LAB_001631b8;
                        }
                        if ((u.uprops[0x42].intrinsic == 0) &&
                           ((u.uprops[0x42].extrinsic == 0 &&
                            (bVar4 = match_warn_of_mon(worm), bVar4 == '\0')))) {
                          if (((char)*(uint *)&worm->field_0x60 < '\0') &&
                             (((worm->data->mflags1 & 0x100) != 0 || (worm->data->mlet == '9')))) {
                            *(uint *)&worm->field_0x60 = *(uint *)&worm->field_0x60 & 0xffffff7f;
                          }
                          newsym(local_74,iVar19);
                          goto LAB_00162b6b;
                        }
                      }
                      else {
                        bVar4 = worm_known(level,worm);
                        if (bVar4 == '\0') goto LAB_0016306b;
LAB_0016301a:
                        uVar6 = *(uint *)&worm->field_0x60;
                        if ((((uVar6 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                           (u.uprops[0xc].extrinsic == 0)) {
                          if (((uVar6 & 0x280) == 0) &&
                             (((youmonst.data)->mflags1 & 0x1000000) != 0)) goto LAB_0016305d;
                          goto LAB_0016306b;
                        }
                        if ((uVar6 & 0x280) != 0) goto LAB_0016306b;
LAB_0016305d:
                        if ((u._1052_1_ & 0x20) != 0) goto LAB_0016306b;
                      }
                    }
LAB_001631b8:
                    trap = t_at(level,local_74,iVar19);
                    if ((trap == (trap *)0x0) || ((trap->field_0x8 & 0x20) != 0)) goto LAB_001627fd;
                    uVar14 = mt_random();
                    uVar14 = uVar14 & 7;
                    lVar15 = (long)u.uluck;
                    lVar11 = (long)u.moreluck;
                    if (((int)(lVar11 + lVar15) == 0) ||
                       (uVar6 = mt_random(),
                       SUB168(ZEXT416(uVar6) % SEXT816(0x32 - (lVar11 + lVar15)),0) == 0)) {
LAB_0016326d:
                      if (uVar14 != 0) goto LAB_001627fd;
                    }
                    else {
                      iVar19 = (int)u.moreluck + (int)u.uluck;
                      if (-6 < iVar19) {
                        sVar2 = (short)((uint)(iVar19 * 0x5556) >> 0x10);
                        iVar19 = (int)(short)(sVar2 - (sVar2 >> 0xf));
                      }
                      uVar14 = uVar14 - iVar19;
                      if (-1 < (int)uVar14) {
                        if (7 < uVar14) goto LAB_001627fd;
                        goto LAB_0016326d;
                      }
                    }
                    nomul(0,(char *)0x0);
                    if ((trap->field_0x8 & 0x1f) == 0x14) {
                      pmVar13 = activate_statue_trap(trap,(char)local_68,bVar16,'\0');
                      if (pmVar13 == (monst *)0x0) {
                        return 1;
                      }
                      exercise(2,'\x01');
                      return 1;
                    }
                    find_trap(trap);
                    goto LAB_001627fd;
                  }
                  uVar6 = mt_random();
                  uVar6 = uVar6 % uVar17;
                  lVar15 = (long)u.uluck;
                  lVar11 = (long)u.moreluck;
                  if (((int)(lVar11 + lVar15) == 0) ||
                     (uVar7 = mt_random(),
                     SUB168(ZEXT416(uVar7) % SEXT816(0x32 - (lVar11 + lVar15)),0) == 0)) {
LAB_0016294d:
                    if (uVar6 != 0) goto LAB_001627fd;
                  }
                  else {
                    iVar8 = (int)u.moreluck + (int)u.uluck;
                    if (-6 < iVar8 && -9 < local_70) {
                      iVar8 = (int)(short)((short)iVar8 / 3);
                    }
                    uVar6 = uVar6 - iVar8;
                    if (-1 < (int)uVar6) {
                      if ((int)uVar17 <= (int)uVar6) {
                        uVar6 = 6U - iVar9;
                      }
                      goto LAB_0016294d;
                    }
                  }
                  plVar3 = level;
                  uVar6 = *(uint *)&level->locations[uVar10][uVar14].field_0x6;
                  bVar4 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
                  plVar3->locations[uVar10][uVar14].typ = '\x17';
                  uVar6 = (uVar6 & 0x180 | uVar6 >> 1 & 0x40) ^ 0x40;
                  if (bVar4 != '\0') {
                    uVar6 = 0;
                  }
                  *(uint *)&plVar3->locations[uVar10][uVar14].field_0x6 =
                       *(uint *)&plVar3->locations[uVar10][uVar14].field_0x6 & 0xfffffe0f | uVar6;
                  exercise(2,'\x01');
                  nomul(0,(char *)0x0);
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001629fb;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001629f2;
LAB_00162c1a:
                    newsym(local_74,iVar19);
                  }
                  else {
LAB_001629f2:
                    if (ublindf == (obj *)0x0) {
                      if (aflag != 0) goto LAB_00162c1a;
                    }
                    else {
LAB_001629fb:
                      if ((aflag != 0) || (ublindf->oartifact == '\x1d')) goto LAB_00162c1a;
                    }
                    feel_location((char)local_68,bVar16);
                  }
                  if (flags.verbose == '\0') goto LAB_001627fd;
                  pcVar18 = "You find a secret door.";
                }
                pline(pcVar18);
              }
            }
LAB_001627fd:
            iVar19 = (int)(char)uVar5;
            uVar14 = (uint)u.uy;
            uVar5 = (uint)(byte)((char)uVar5 + 1);
          } while (iVar19 < (int)(uVar14 + 2));
          uVar5 = (uint)(byte)u.ux;
        }
        bVar16 = (char)local_68 + 1;
        local_68 = (ulong)bVar16;
        local_74 = (int)(char)bVar16;
      } while (local_74 < (char)uVar5 + 2);
    }
  }
  else if (aflag == 0) {
    pline("What are you looking for?  The exit?");
  }
  return 1;
}

Assistant:

int dosearch0(int aflag)
{
	xchar x, y;
	struct trap *trap;
	struct monst *mtmp;

	if (u.uswallow) {
		if (!aflag)
			pline("What are you looking for?  The exit?");
	} else {
	    int fund = (uwep && uwep->oartifact &&
		    spec_ability(uwep, SPFX_SEARCH)) ?
		    uwep->spe : 0;
	    if (ublindf && ublindf->otyp == LENSES && !Blind)
		    fund += 2; /* JDS: lenses help searching */
	    if (fund > 5) fund = 5;
	    for (x = u.ux-1; x < u.ux+2; x++)
	      for (y = u.uy-1; y < u.uy+2; y++) {
		if (!isok(x,y)) continue;
		if (x != u.ux || y != u.uy) {
		    if (Blind && !aflag) feel_location(x,y);
		    if (level->locations[x][y].typ == SDOOR) {
			if (rnl(7-fund)) continue;
			cvt_sdoor_to_door(&level->locations[x][y], &u.uz); /* .typ = DOOR */
			exercise(A_WIS, TRUE);
			nomul(0, NULL);
			if (Blind && !aflag)
			    feel_location(x,y);	/* make sure it shows up */
			else
			    newsym(x,y);
			if (flags.verbose) pline("You find a secret door.");
		    } else if (level->locations[x][y].typ == SCORR) {
			if (rnl(7-fund)) continue;
			level->locations[x][y].typ = CORR;
			unblock_point(x,y);	/* vision */
			exercise(A_WIS, TRUE);
			nomul(0, NULL);
			newsym(x,y);
			if (flags.verbose) pline("You find a secret passage.");
		    } else {
		/* Be careful not to find anything in an SCORR or SDOOR */
			if ((mtmp = m_at(level, x, y)) && !aflag) {
			    if (mtmp->m_ap_type) {
				seemimic(mtmp);
		find:		exercise(A_WIS, TRUE);
				if (!canspotmon(level, mtmp)) {
				    if (level->locations[x][y].mem_invis) {
					/* found invisible monster in a square
					 * which already has an 'I' in it.
					 * Logically, this should still take
					 * time and lead to a return(1), but if
					 * we did that the player would keep
					 * finding the same monster every turn.
					 */
					continue;
				    } else {
					pline("You feel an unseen monster!");
					map_invisible(x, y);
				    }
				} else if (!sensemon(mtmp))
				    pline("You find %s.", a_monnam(mtmp));
				return 1;
			    }
			    if (!canspotmon(level, mtmp)) {
				if (mtmp->mundetected &&
				   (is_hider(mtmp->data) || mtmp->data->mlet == S_EEL))
					mtmp->mundetected = 0;
				newsym(x,y);
				goto find;
			    }
			}

			/* see if an invisible monster has moved--if Blind,
			 * feel_location() already did it
			 */
			if (!aflag && !mtmp && !Blind &&
				    level->locations[x][y].mem_invis) {
			    unmap_object(x,y);
			    newsym(x,y);
			}

			if ((trap = t_at(level, x,y)) && !trap->tseen && !rnl(8)) {
			    nomul(0, NULL);

			    if (trap->ttyp == STATUE_TRAP) {
				if (activate_statue_trap(trap, x, y, FALSE))
				    exercise(A_WIS, TRUE);
				return 1;
			    } else {
				find_trap(trap);
			    }
			}
		    }
		}
	    }
	}
	return 1;
}